

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void update_perf_tbl_with_cptp_json_perf_data(AppCtx *ctx,PerfProfRunHandle *handle)

{
  cJSON *root_00;
  cJSON *root;
  PerfProfRun run;
  PerfProfRunHandle *handle_local;
  AppCtx *ctx_local;
  
  run.solution.stats[2] = (double)handle;
  make_solver_run((PerfProfRun *)&root,ctx->current_batch,handle->solver_name);
  if ((*(char *)((long)run.solution.stats[2] + 0x11b9) != '\0') &&
     (root_00 = load_json((char *)((long)run.solution.stats[2] + 0x11b9)), root_00 != (cJSON *)0x0))
  {
    parse_cptp_solver_json_dump((PerfProfRun *)&root,root_00);
    cJSON_Delete(root_00);
  }
  store_perfprof_run(&ctx->perf_tbl,(PerfProfInputUniqueId *)((long)run.solution.stats[2] + 0x1130),
                     (PerfProfRun *)&root);
  return;
}

Assistant:

static void
update_perf_tbl_with_cptp_json_perf_data(AppCtx *ctx,
                                         PerfProfRunHandle *handle) {
    PerfProfRun run = make_solver_run(ctx->current_batch, handle->solver_name);
    if (handle->json_output_path[0] != '\0') {
        cJSON *root = load_json(handle->json_output_path);
        if (root) {
            parse_cptp_solver_json_dump(&run, root);
            cJSON_Delete(root);
        }
    }
    store_perfprof_run(&ctx->perf_tbl, &handle->input.uid, &run);
}